

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>::operator=
          (CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig> *this,
          CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig> *other)

{
  FtraceConfig_CompactSchedConfig *this_00;
  CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig> *other_local;
  CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (FtraceConfig_CompactSchedConfig *)operator_new(0x38);
  perfetto::protos::gen::FtraceConfig_CompactSchedConfig::FtraceConfig_CompactSchedConfig(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }